

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O0

wchar_t rd_artifacts(void)

{
  char *message;
  uint8_t local_13;
  ushort local_12;
  int local_10;
  uint8_t tmp8u;
  wchar_t wStack_c;
  uint16_t tmp16u;
  wchar_t i;
  
  rd_u16b(&local_12);
  if (z_info->a_max < local_12) {
    message = format("Too many (%u) artifacts!",(ulong)local_12);
    note(message);
    wStack_c = L'\xffffffff';
  }
  else {
    for (local_10 = 0; local_10 < (int)(uint)local_12; local_10 = local_10 + 1) {
      rd_byte(&local_13);
      aup_info[local_10].created = local_13 != '\0';
      rd_byte(&local_13);
      aup_info[local_10].seen = local_13 != '\0';
      rd_byte(&local_13);
      aup_info[local_10].everseen = local_13 != '\0';
      rd_byte(&local_13);
    }
    wStack_c = L'\0';
  }
  return wStack_c;
}

Assistant:

int rd_artifacts(void)
{
	int i;
	uint16_t tmp16u;

	/* Load the Artifacts */
	rd_u16b(&tmp16u);
	if (tmp16u > z_info->a_max) {
		note(format("Too many (%u) artifacts!", tmp16u));
		return (-1);
	}

	/* Read the artifact flags */
	for (i = 0; i < tmp16u; i++) {
		uint8_t tmp8u;

		rd_byte(&tmp8u);
		aup_info[i].created = tmp8u ? true : false;
		rd_byte(&tmp8u);
		aup_info[i].seen = tmp8u ? true : false;
		rd_byte(&tmp8u);
		aup_info[i].everseen = tmp8u ? true : false;
		rd_byte(&tmp8u);
	}

	return 0;
}